

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_register_allocation.cpp
# Opt level: O0

Module * mocker::allocateRegistersNaively(Module *__return_storage_ptr__,Module *module)

{
  Section *pSVar1;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_79;
  string local_78;
  Section local_58;
  undefined1 local_19;
  Module *local_18;
  Module *module_local;
  Module *res;
  
  local_19 = 0;
  local_18 = module;
  module_local = __return_storage_ptr__;
  nasm::Module::Module(__return_storage_ptr__,module);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,".text",&local_79);
  pSVar1 = nasm::Module::getSection(__return_storage_ptr__,&local_78);
  anon_unknown_2::allocate(&local_58,pSVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,".text",&local_b1);
  pSVar1 = nasm::Module::getSection(__return_storage_ptr__,&local_b0);
  nasm::Section::operator=(pSVar1,&local_58);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  nasm::Section::~Section(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  return __return_storage_ptr__;
}

Assistant:

nasm::Module allocateRegistersNaively(const nasm::Module &module) {
  nasm::Module res(module);
  res.getSection(".text") = allocate(res.getSection(".text"));
  return res;
}